

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O3

void (anonymous_namespace)::check<Imf_3_4::DeepScanLineInputFile,Imf_3_4::DeepScanLineOutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  void *pvVar7;
  size_t sVar8;
  DeepScanLineOutputFile file;
  Header f;
  long *local_98;
  long local_90;
  long local_88 [2];
  undefined8 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  Header local_58 [56];
  
  local_78 = 0;
  Imf_3_4::Header::Header(local_58,0x40,0x40,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pcVar3 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&local_78,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar3,(Channel *)"Dummy");
  sVar8 = *(size_t *)(filename + 8);
  if ((sVar8 != DAT_001eafb0) ||
     ((sVar8 != 0 &&
      (iVar2 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8), iVar2 != 0))
     )) {
    Imf_3_4::Header::setType((string *)local_58);
  }
  puVar4 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar4 = 2;
  remove("/var/tmp/badfile.exr");
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
            ((DeepScanLineOutputFile *)&local_78,"/var/tmp/badfile.exr",local_58,iVar2);
  Imf_3_4::DeepScanLineOutputFile::~DeepScanLineOutputFile((DeepScanLineOutputFile *)&local_78);
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_78,"/var/tmp/badfile.exr",iVar2,true);
  sVar8 = DAT_001eaf68;
  if (DAT_001eaf68 == DAT_001eafb0) {
    if (DAT_001eaf68 == 0) {
LAB_0012fb98:
      sVar8 = 0;
    }
    else {
      iVar2 = bcmp(Imf_3_4::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                   DAT_001eaf68);
      if (iVar2 != 0) goto LAB_0012fa85;
    }
  }
  else {
LAB_0012fa85:
    Imf_3_4::MultiPartInputFile::header((int)&local_78);
    puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar8 = puVar5[1];
    if (sVar8 == DAT_001eaf68) {
      if (sVar8 == 0) goto LAB_0012fb98;
      iVar2 = bcmp((void *)*puVar5,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar8);
      if (iVar2 == 0) goto LAB_0012fc17;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,Imf_3_4::DEEPSCANLINE_abi_cxx11_,DAT_001eaf68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," but got ",9);
    Imf_3_4::MultiPartInputFile::header((int)&local_78);
    puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)*puVar5,puVar5[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from multipart when input type was ",0x24);
    sVar8 = *(size_t *)(filename + 8);
    if (sVar8 == DAT_001eafb0) {
      if (sVar8 != 0) {
        pvVar7 = *(void **)filename;
        iVar2 = bcmp(pvVar7,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
        if (iVar2 != 0) goto LAB_0012fba0;
      }
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unset","");
    }
    else {
      pvVar7 = *(void **)filename;
LAB_0012fba0:
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char*>((string *)&local_98,pvVar7,sVar8 + (long)pvVar7);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_98,local_90);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    sVar8 = DAT_001eaf68;
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
      sVar8 = DAT_001eaf68;
    }
  }
LAB_0012fc17:
  if ((sVar8 != DAT_001eafb0) ||
     ((sVar8 != 0 &&
      (iVar2 = bcmp(Imf_3_4::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8)
      , iVar2 != 0)))) {
    Imf_3_4::MultiPartInputFile::header((int)&local_78);
    puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar8 = puVar5[1];
    if ((sVar8 != DAT_001eaf68) ||
       ((sVar8 != 0 &&
        (iVar2 = bcmp((void *)*puVar5,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar8), iVar2 != 0)))) {
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::DeepScanLineInputFile, OUT = Imf_3_4::DeepScanLineOutputFile]"
                   );
    }
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)&local_78,"/var/tmp/badfile.exr",iVar2);
  if ((DAT_001eaf68 == DAT_001eafb0) &&
     ((DAT_001eaf68 == 0 ||
      (iVar2 = bcmp(Imf_3_4::DEEPSCANLINE_abi_cxx11_,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,
                    DAT_001eaf68), iVar2 == 0)))) {
    Imf_3_4::DeepScanLineInputFile::header();
    cVar1 = Imf_3_4::Header::hasType();
    if (cVar1 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_4::DeepScanLineInputFile::header();
    cVar1 = Imf_3_4::Header::hasType();
    if (cVar1 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::DeepScanLineInputFile, OUT = Imf_3_4::DeepScanLineOutputFile]"
                   );
    }
    goto LAB_0012fedb;
  }
  Imf_3_4::DeepScanLineInputFile::header();
  puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  sVar8 = puVar5[1];
  if ((sVar8 == DAT_001eaf68) &&
     ((sVar8 == 0 ||
      (iVar2 = bcmp((void *)*puVar5,Imf_3_4::DEEPSCANLINE_abi_cxx11_,sVar8), iVar2 == 0))))
  goto LAB_0012fedb;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,Imf_3_4::DEEPSCANLINE_abi_cxx11_,DAT_001eaf68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," but got ",9);
  Imf_3_4::DeepScanLineInputFile::header();
  puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)*puVar5,puVar5[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," when input type was ",0x15);
  sVar8 = *(size_t *)(filename + 8);
  if (sVar8 == DAT_001eafb0) {
    if (sVar8 != 0) {
      pvVar7 = *(void **)filename;
      iVar2 = bcmp(pvVar7,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_0012fe6b;
    }
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unset","");
  }
  else {
    pvVar7 = *(void **)filename;
LAB_0012fe6b:
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char*>((string *)&local_98,pvVar7,sVar8 + (long)pvVar7);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_98,local_90);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
LAB_0012fedb:
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  remove("/var/tmp/badfile.exr");
  Imf_3_4::Header::~Header(local_58);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}